

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometricsizeclass.h
# Opt level: O0

int Hoard::GeometricSizeClass<20UL,_16UL>::size2class(size_t sz)

{
  int iVar1;
  unsigned_long uVar2;
  ulong in_RDI;
  int mid;
  int right;
  int left;
  int local_10;
  int cl;
  
  cl = 0;
  local_10 = 0x6e;
  iVar1 = local_10;
  while (local_10 = iVar1, cl < local_10) {
    iVar1 = (cl + local_10) / 2;
    uVar2 = c2s(cl);
    if (uVar2 < in_RDI) {
      cl = iVar1 + 1;
      iVar1 = local_10;
    }
  }
  return cl;
}

Assistant:

static int constexpr size2class (const size_t sz) {
      // Do a binary search to find the right size class.
      int left  = 0;
      int right = NUM_SIZECLASSES - 1;
      while (left < right) {
	int mid = (left + right)/2;
	if (c2s(mid) < sz) {
	  left = mid + 1;
	} else {
	  right = mid;
	}
      }
      assert (c2s(left) >= sz);
      assert ((left == 0) || (c2s(left-1) < sz));
      return left;
    }